

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateOptions
          (DescriptorBuilder *this,EnumDescriptor *enm,EnumDescriptorProto *proto)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  bool bVar1;
  int iVar2;
  EnumValueDescriptor *this_00;
  EnumValueDescriptorProto *pEVar3;
  EnumOptions *pEVar4;
  string_view sVar5;
  VoidPtr local_e0;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_d8;
  string_view local_d0;
  undefined1 local_c0 [8];
  anon_class_24_3_0c655f7d make_error;
  undefined1 auStack_a0 [7];
  bool inserted;
  char *local_98;
  int local_8c;
  undefined1 local_88 [8];
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  insert_result;
  EnumValueDescriptor *enum_value;
  int local_54;
  undefined1 local_50 [4];
  int i;
  flat_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  used_values;
  EnumDescriptorProto *proto_local;
  EnumDescriptor *enm_local;
  DescriptorBuilder *this_local;
  
  proto_local = (EnumDescriptorProto *)enm;
  enm_local = (EnumDescriptor *)this;
  CheckEnumValueUniqueness(this,proto,enm);
  bVar1 = EnumDescriptor::is_closed((EnumDescriptor *)proto_local);
  if ((!bVar1) && (iVar2 = EnumDescriptor::value_count((EnumDescriptor *)proto_local), 0 < iVar2)) {
    this_00 = EnumDescriptor::value((EnumDescriptor *)proto_local,0);
    iVar2 = EnumValueDescriptor::number(this_00);
    if (iVar2 != 0) {
      join_0x00000010_0x00000000_ = EnumDescriptor::full_name((EnumDescriptor *)proto_local);
      pEVar3 = EnumDescriptorProto::value(proto,0);
      AddError(this,stack0xffffffffffffffd0,&pEVar3->super_Message,NUMBER,
               "The first enum value must be zero for open enums.");
    }
  }
  pEVar4 = EnumDescriptor::options((EnumDescriptor *)proto_local);
  bVar1 = EnumOptions::has_allow_alias(pEVar4);
  if (bVar1) {
    pEVar4 = EnumDescriptor::options((EnumDescriptor *)proto_local);
    bVar1 = EnumOptions::allow_alias(pEVar4);
    if (bVar1) {
      return;
    }
  }
  absl::lts_20250127::
  flat_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::flat_hash_map((flat_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_50);
  local_54 = 0;
  while( true ) {
    iVar2 = EnumDescriptor::value_count((EnumDescriptor *)proto_local);
    if (iVar2 <= local_54) break;
    insert_result._16_8_ = EnumDescriptor::value((EnumDescriptor *)proto_local,local_54);
    local_8c = EnumValueDescriptor::number((EnumValueDescriptor *)insert_result._16_8_);
    sVar5 = EnumValueDescriptor::full_name((EnumValueDescriptor *)insert_result._16_8_);
    _auStack_a0 = sVar5;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::emplace<int,_std::basic_string_view<char,_std::char_traits<char>_>,_0>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_88,
               (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_50,&local_8c,(basic_string_view<char,_std::char_traits<char>_> *)auStack_a0)
    ;
    make_error.insert_result._7_1_ = insert_result.first.field_1._0_1_ & 1;
    if (make_error.insert_result._7_1_ == 0) {
      pEVar4 = EnumDescriptor::options((EnumDescriptor *)proto_local);
      bVar1 = EnumOptions::allow_alias(pEVar4);
      if (!bVar1) {
        local_c0 = (undefined1  [8])&proto_local;
        make_error.enm = (EnumDescriptor **)&insert_result.second;
        make_error.enum_value = (EnumValueDescriptor **)local_88;
        sVar5 = EnumDescriptor::full_name((EnumDescriptor *)proto_local);
        local_d0 = sVar5;
        pEVar3 = EnumDescriptorProto::value(proto,local_54);
        absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
        FunctionRef<google::protobuf::DescriptorBuilder::ValidateOptions(google::protobuf::EnumDescriptor_const*,google::protobuf::EnumDescriptorProto_const&)::__0,void>
                  ((FunctionRef<std::__cxx11::string()> *)&local_e0,
                   (anon_class_24_3_0c655f7d *)local_c0);
        make_error_00.invoker_ = p_Stack_d8;
        make_error_00.ptr_.obj = local_e0.obj;
        AddError(this,local_d0,&pEVar3->super_Message,NUMBER,make_error_00);
      }
    }
    local_54 = local_54 + 1;
  }
  absl::lts_20250127::
  flat_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~flat_hash_map((flat_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_50);
  return;
}

Assistant:

void DescriptorBuilder::ValidateOptions(const EnumDescriptor* enm,
                                        const EnumDescriptorProto& proto) {
  CheckEnumValueUniqueness(proto, enm);

  if (!enm->is_closed() && enm->value_count() > 0 &&
      enm->value(0)->number() != 0) {
    AddError(enm->full_name(), proto.value(0),
             DescriptorPool::ErrorCollector::NUMBER,
             "The first enum value must be zero for open enums.");
  }

  if (!enm->options().has_allow_alias() || !enm->options().allow_alias()) {
    absl::flat_hash_map<int, std::string> used_values;
    for (int i = 0; i < enm->value_count(); ++i) {
      const EnumValueDescriptor* enum_value = enm->value(i);
      auto insert_result =
          used_values.emplace(enum_value->number(), enum_value->full_name());
      bool inserted = insert_result.second;
      if (!inserted) {
        if (!enm->options().allow_alias()) {
          // Generate error if duplicated enum values are explicitly disallowed.
          auto make_error = [&] {
            // Find the next free number.
            absl::flat_hash_set<int64_t> used;
            for (int j = 0; j < enm->value_count(); ++j) {
              used.insert(enm->value(j)->number());
            }
            int64_t next_value = static_cast<int64_t>(enum_value->number()) + 1;
            while (used.contains(next_value)) ++next_value;

            std::string error = absl::StrCat(
                "\"", enum_value->full_name(),
                "\" uses the same enum value as \"",
                insert_result.first->second,
                "\". If this is intended, set "
                "'option allow_alias = true;' to the enum definition.");
            if (next_value < std::numeric_limits<int32_t>::max()) {
              absl::StrAppend(&error, " The next available enum value is ",
                              next_value, ".");
            }
            return error;
          };
          AddError(enm->full_name(), proto.value(i),
                   DescriptorPool::ErrorCollector::NUMBER, make_error);
        }
      }
    }
  }
}